

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
SetUnsignaled(RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this)

{
  Char *Message;
  char (*in_RCX) [16];
  undefined1 local_30 [8];
  string msg;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this_local;
  
  if ((this->m_IsUnsignaled & 1U) != 0) {
    msg.field_2._8_8_ = this;
    Diligent::FormatString<char[26],char[16]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!m_IsUnsignaled",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"SetUnsignaled",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanSyncObjectManager.hpp"
               ,0x8d);
    std::__cxx11::string::~string((string *)local_30);
  }
  this->m_IsUnsignaled = true;
  return;
}

Assistant:

void SetUnsignaled()
    {
        VERIFY_EXPR(!m_IsUnsignaled);
        m_IsUnsignaled = true;
    }